

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_data.c
# Opt level: O1

mpt_value_store * mpt_stage_data(mpt_rawdata_stage *st,uint dim)

{
  ulong uVar1;
  int iVar2;
  mpt_type_traits *pmVar3;
  int *piVar4;
  mpt_buffer *pmVar5;
  mpt_value_store *pmVar6;
  uint uVar7;
  
  if (st->_max_dimensions <= dim && st->_max_dimensions != 0) {
    piVar4 = __errno_location();
    *piVar4 = 0xc;
    return (mpt_value_store *)0x0;
  }
  uVar1 = (ulong)dim;
  pmVar5 = (st->_d)._buf;
  pmVar3 = mpt_value_store_traits();
  if (pmVar3 == (mpt_type_traits *)0x0) {
LAB_0010a7c2:
    piVar4 = __errno_location();
    *piVar4 = 0x39;
  }
  else {
    if (pmVar5 == (mpt_buffer *)0x0) {
      uVar7 = 0;
    }
    else {
      if (pmVar3 != pmVar5->_content_traits) goto LAB_0010a7c2;
      uVar7 = (uint)(pmVar5->_used >> 4);
    }
    iVar2 = dim * 0x10 + 0x10;
    if (dim < uVar7) {
      iVar2 = uVar7 << 4;
    }
    if (pmVar5 == (mpt_buffer *)0x0) {
      pmVar5 = (mpt_buffer *)_mpt_buffer_alloc(iVar2,0);
      if (pmVar5 == (mpt_buffer *)0x0) {
        return (mpt_value_store *)0x0;
      }
      pmVar5->_content_traits = pmVar3;
      pmVar6 = (mpt_value_store *)mpt_buffer_insert(pmVar5,uVar1 << 4,0x10);
      if (pmVar6 != (mpt_value_store *)0x0) {
        iVar2 = (*pmVar3->init)(pmVar6,(void *)0x0);
        if (-1 < iVar2) {
          (st->_d)._buf = pmVar5;
          return pmVar6;
        }
        piVar4 = __errno_location();
        *piVar4 = 0x5f;
      }
      (*pmVar5->_vptr->unref)(pmVar5);
    }
    else {
      pmVar5 = (*pmVar5->_vptr->detach)(pmVar5,(size_t)iVar2);
      if (pmVar5 != (mpt_buffer *)0x0) {
        (st->_d)._buf = pmVar5;
        if (dim < uVar7) {
          return (mpt_value_store *)(&pmVar5[1]._vptr + uVar1 * 2);
        }
        pmVar6 = (mpt_value_store *)mpt_buffer_insert(pmVar5,uVar1 << 4,0x10);
        if (pmVar6 != (mpt_value_store *)0x0) {
          (*pmVar3->init)(pmVar6,(void *)0x0);
          return pmVar6;
        }
        return (mpt_value_store *)0x0;
      }
    }
  }
  return (mpt_value_store *)0x0;
}

Assistant:

extern MPT_STRUCT(value_store) *mpt_stage_data(MPT_STRUCT(rawdata_stage) *st, unsigned dim)
{
	MPT_STRUCT(buffer) *buf = st->_d._buf;
	const MPT_STRUCT(type_traits) *traits;
	MPT_STRUCT(value_store) *val;
	unsigned max = 0, used = 0;
	
	/* not allowed to extend dimensions */
	if (st->_max_dimensions
	    && (dim >= st->_max_dimensions)) {
		errno = ENOMEM;
		return 0;
	}
	/* array element traits for value store */
	if (!(traits = mpt_value_store_traits())) {
		errno = EBADSLT;
		return 0;
	}
	/* existing buffer must be valied */
	if (buf) {
		if (traits != buf->_content_traits) {
			errno = EBADSLT;
			return 0;
		}
		used = buf->_used / sizeof(*val);
		max  = used;
	}
	if (dim < used) {
		max = used * sizeof(*val);
	} else {
		max = (dim + 1) * sizeof(*val);
	}
	if (!buf) {
		if (!(buf = _mpt_buffer_alloc(max, 0))) {
			return 0;
		}
		buf->_content_traits = traits;
		if (!(val = mpt_buffer_insert(buf, dim * sizeof(*val), sizeof(*val)))) {
			buf->_vptr->unref(buf);
			return 0;
		}
		if ((traits->init(val, 0) < 0)) {
			errno = ENOTSUP;
			buf->_vptr->unref(buf);
			return 0;
		}
		st->_d._buf = buf;
		return val;
	}
	if (!(buf = buf->_vptr->detach(buf, max))) {
		return 0;
	}
	st->_d._buf = buf;
	
	if (dim < used) {
		val = (void *) (buf + 1);
		return val + dim;
	}
	/* execute init function for inserted data */
	if ((val = mpt_buffer_insert(buf, dim * sizeof(*val), sizeof(*val)))) {
		traits->init(val, 0);
	}
	return val;
}